

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int arkSetCFLFraction(void *arkode_mem,realtype cfl_frac)

{
  double in_XMM0_Qa;
  ARKodeMem ark_mem;
  ARKodeHAdaptMem hadapt_mem;
  int retval;
  ARKodeMem *in_stack_ffffffffffffffc8;
  ARKodeMem in_stack_ffffffffffffffd0;
  void *in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = arkAccessHAdaptMem(in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0,
                               in_stack_ffffffffffffffc8,(ARKodeHAdaptMem *)0x114a7aa);
  if (local_4 == 0) {
    if (in_XMM0_Qa < 1.0) {
      if (0.0 < in_XMM0_Qa) {
        *(double *)((long)in_stack_ffffffffffffffd8 + 0x68) = in_XMM0_Qa;
      }
      else {
        *(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0x68) = 0x3fe0000000000000;
      }
      local_4 = 0;
    }
    else {
      arkProcessError(in_stack_ffffffffffffffd0,-0x16,"ARKode","arkSetCFLFraction",
                      "Illegal CFL fraction");
      local_4 = -0x16;
    }
  }
  return local_4;
}

Assistant:

int arkSetCFLFraction(void *arkode_mem, realtype cfl_frac)
{
  int retval;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  retval = arkAccessHAdaptMem(arkode_mem, "arkSetCFLFraction",
                              &ark_mem, &hadapt_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* check for allowable parameters */
  if (cfl_frac >= ONE) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                    "arkSetCFLFraction", "Illegal CFL fraction");
    return(ARK_ILL_INPUT);
  }

  /* set positive-valued parameters, otherwise set default */
  if (cfl_frac <= ZERO) {
    hadapt_mem->cfl = CFLFAC;
  } else {
    hadapt_mem->cfl = cfl_frac;
  }

  return(ARK_SUCCESS);
}